

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_udp_ref3(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_240 [8];
  uv_udp_t h;
  uv_udp_send_t req;
  uv_buf_t buf;
  sockaddr_in addr;
  
  join_0x00000010_0x00000000_ = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ref.c",
            0x14a,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  uv_udp_init(puVar2,(uv_udp_t *)local_240);
  uv_udp_send((uv_udp_send_t *)(h.write_completed_queue + 1),(uv_udp_t *)local_240,
              (uv_buf_t *)&req.bufsml[3].len,1,(sockaddr *)&buf.len,req_cb);
  uv_unref((uv_handle_t *)local_240);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (req_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ref.c",
            0x154,"req_cb_called == 1");
    abort();
  }
  do_close(local_240);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ref.c",
            0x157,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_ref3) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_send_t req;
  uv_udp_t h;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_send(&req,
              &h,
              &buf,
              1,
              (const struct sockaddr*) &addr,
              (uv_udp_send_cb) req_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(req_cb_called == 1);
  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}